

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode::SectionNode
          (SectionNode *this,SectionStats *_stats)

{
  SectionStats *_stats_local;
  SectionNode *this_local;
  
  this->_vptr_SectionNode = (_func_int **)&PTR__SectionNode_0024dc68;
  SectionStats::SectionStats(&this->stats,_stats);
  clara::std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
  ::vector(&this->childSections);
  clara::std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>::vector
            (&this->assertions);
  std::__cxx11::string::string((string *)&this->stdOut);
  std::__cxx11::string::string((string *)&this->stdErr);
  return;
}

Assistant:

explicit SectionNode(SectionStats const& _stats) : stats(_stats) {}